

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFieldValueFromString
          (Parser *this,string *input,FieldDescriptor *field,Message *output)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ArrayInputStream input_stream;
  ParserImpl parser;
  
  io::ArrayInputStream::ArrayInputStream
            (&input_stream,(input->_M_dataplus)._M_p,(int)input->_M_string_length,-1);
  iVar2 = (*(output->super_MessageLite)._vptr_MessageLite[0x15])(output);
  ParserImpl::ParserImpl
            (&parser,(Descriptor *)CONCAT44(extraout_var,iVar2),
             &input_stream.super_ZeroCopyInputStream,this->error_collector_,this->finder_,
             this->parse_info_tree_,ALLOW_SINGULAR_OVERWRITES,this->allow_case_insensitive_field_,
             this->allow_unknown_field_,this->allow_unknown_extension_,this->allow_unknown_enum_,
             this->allow_field_number_,this->allow_relaxed_whitespace_,this->allow_partial_,
             this->recursion_limit_);
  bVar1 = ParserImpl::ParseField(&parser,field,output);
  ParserImpl::~ParserImpl(&parser);
  return bVar1;
}

Assistant:

bool TextFormat::Parser::ParseFieldValueFromString(const std::string& input,
                                                   const FieldDescriptor* field,
                                                   Message* output) {
  io::ArrayInputStream input_stream(input.data(), input.size());
  ParserImpl parser(
      output->GetDescriptor(), &input_stream, error_collector_, finder_,
      parse_info_tree_, ParserImpl::ALLOW_SINGULAR_OVERWRITES,
      allow_case_insensitive_field_, allow_unknown_field_,
      allow_unknown_extension_, allow_unknown_enum_, allow_field_number_,
      allow_relaxed_whitespace_, allow_partial_, recursion_limit_);
  return parser.ParseField(field, output);
}